

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O2

WOPNFile * WOPN_LoadBankFromMem(void *mem,size_t length,int *error)

{
  byte bVar1;
  WOPNBank *pWVar2;
  int iVar3;
  WOPNFile *file;
  ulong uVar4;
  ushort version;
  ushort uVar5;
  long lVar6;
  long lVar7;
  ushort melodic_banks;
  uint8_t *cursor;
  bool bVar8;
  long lStack_a0;
  uint16_t bankslots_sizes [2];
  ulong local_78;
  WOPNBank *local_68 [3];
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  if (mem == (void *)0x0) {
    if (error == (int *)0x0) {
      return (WOPNFile *)0x0;
    }
    iVar3 = 6;
    goto LAB_00159312;
  }
  if (10 < length) {
    lStack_a0 = 0xb;
    iVar3 = bcmp(mem,"WOPN2-BANK",0xb);
    if (iVar3 == 0) {
      version = 1;
      lVar6 = -0xb;
    }
    else {
      iVar3 = bcmp(mem,"WOPN2-B2NK",0xb);
      if (iVar3 != 0) {
        if (error == (int *)0x0) {
          return (WOPNFile *)0x0;
        }
        iVar3 = 1;
        goto LAB_00159312;
      }
      if (length - 0xb < 2) goto LAB_001592c5;
      version = *(ushort *)((long)mem + 0xb);
      if (2 < version) {
        if (error == (int *)0x0) {
          return (WOPNFile *)0x0;
        }
        iVar3 = 4;
        goto LAB_00159312;
      }
      lStack_a0 = -0xd;
      lVar6 = lStack_a0;
      lStack_a0 = 0xd;
    }
    if (4 < lVar6 + length) {
      bVar1 = *(byte *)((long)mem + lStack_a0 + 4);
      uVar5 = *(ushort *)((long)mem + lStack_a0 + 2);
      melodic_banks =
           *(ushort *)((long)mem + lStack_a0) << 8 | *(ushort *)((long)mem + lStack_a0) >> 8;
      uVar5 = uVar5 << 8 | uVar5 >> 8;
      file = WOPN_Init(melodic_banks,uVar5);
      if (file == (WOPNFile *)0x0) {
        if (error == (int *)0x0) {
          return (WOPNFile *)0x0;
        }
        iVar3 = 5;
        goto LAB_00159312;
      }
      cursor = (uint8_t *)((long)mem + lStack_a0 + 5);
      local_78 = (lVar6 + length) - 5;
      file->version = version;
      file->lfo_freq = bVar1 & 0xf;
      if (version < 2) {
        file->volume_model = '\0';
        bankslots_sizes[0] = melodic_banks;
        bankslots_sizes[1] = uVar5;
        local_68[0] = file->banks_melodic;
        local_68[1] = file->banks_percussive;
        uVar5 = 0x41;
      }
      else {
        file->chip_type = bVar1 >> 4 & 1;
        file->volume_model = '\0';
        bankslots_sizes[0] = melodic_banks;
        bankslots_sizes[1] = uVar5;
        local_68[0] = file->banks_melodic;
        local_68[1] = file->banks_percussive;
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          uVar5 = bankslots_sizes[lVar6];
          for (lVar7 = 0; (ulong)uVar5 * 0x2424 - lVar7 != 0; lVar7 = lVar7 + 0x2424) {
            bVar8 = local_78 < 0x22;
            local_78 = local_78 - 0x22;
            if (bVar8) goto LAB_00159532;
            pWVar2 = local_68[lVar6];
            strncpy(pWVar2->bank_name + lVar7,(char *)cursor,0x20);
            pWVar2->bank_name[lVar7 + 0x20] = '\0';
            pWVar2->ins[0].inst_name[lVar7 + -3] = cursor[0x20];
            pWVar2->ins[0].inst_name[lVar7 + -2] = cursor[0x21];
            cursor = cursor + 0x22;
          }
        }
        uVar5 = 0x45;
      }
      local_50 = (ulong)uVar5 << 7;
      lVar6 = 0;
      while( true ) {
        if (lVar6 == 2) {
          return file;
        }
        local_40 = (ulong)bankslots_sizes[lVar6];
        uVar4 = (ulong)bankslots_sizes[lVar6] * local_50;
        bVar8 = local_78 < uVar4;
        local_78 = local_78 - uVar4;
        if (bVar8) break;
        lVar7 = 0;
        local_48 = lVar6;
        uVar4 = 0;
        while (uVar4 != local_40) {
          local_38 = uVar4;
          pWVar2 = local_68[local_48];
          for (lVar6 = 0x24; lVar6 != 0x2424; lVar6 = lVar6 + 0x48) {
            WOPN_parseInstrument
                      ((WOPNInstrument *)(pWVar2->bank_name + lVar6 + lVar7),cursor,version,'\x01');
            cursor = cursor + uVar5;
          }
          lVar7 = lVar7 + 0x2424;
          uVar4 = local_38 + 1;
        }
        lVar6 = local_48 + 1;
      }
LAB_00159532:
      WOPN_Free(file);
    }
  }
LAB_001592c5:
  if (error == (int *)0x0) {
    return (WOPNFile *)0x0;
  }
  iVar3 = 2;
LAB_00159312:
  *error = iVar3;
  return (WOPNFile *)0x0;
}

Assistant:

WOPNFile *WOPN_LoadBankFromMem(void *mem, size_t length, int *error)
{
    WOPNFile *outFile = NULL;
    uint16_t i = 0, j = 0, k = 0;
    uint16_t version = 0;
    uint16_t count_melodic_banks     = 1;
    uint16_t count_percussive_banks   = 1;
    uint8_t *cursor = (uint8_t *)mem;

    WOPNBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

#define SET_ERROR(err) \
{\
    WOPN_Free(outFile);\
    if(error)\
    {\
        *error = err;\
    }\
}

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(!cursor)
    {
        SET_ERROR(WOPN_ERR_NULL_POINTER);
        return NULL;
    }

    {/* Magic number */
        if(length < 11)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        if(memcmp(cursor, wopn2_magic1, 11) == 0)
        {
            version = 1;
        }
        else if(memcmp(cursor, wopn2_magic2, 11) != 0)
        {
            SET_ERROR(WOPN_ERR_BAD_MAGIC);
            return NULL;
        }
        GO_FORWARD(11);
    }

    if (version == 0)
    {/* Version code */
        if(length < 2)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        version = toUint16LE(cursor);
        if(version > wopn_latest_version)
        {
            SET_ERROR(WOPN_ERR_NEWER_VERSION);
            return NULL;
        }
        GO_FORWARD(2);
    }

    {/* Header of WOPN */
        uint8_t head[5];
        if(length < 5)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        memcpy(head, cursor, 5);
        count_melodic_banks = toUint16BE(head);
        count_percussive_banks = toUint16BE(head + 2);
        GO_FORWARD(5);

        outFile = WOPN_Init(count_melodic_banks, count_percussive_banks);
        if(!outFile)
        {
            SET_ERROR(WOPN_ERR_OUT_OF_MEMORY);
            return NULL;
        }

        outFile->version      = version;
        outFile->lfo_freq     = head[4] & 0xf;
        if(version >= 2)
            outFile->chip_type = (head[4] >> 4) & 1;
        outFile->volume_model = 0;
    }

    bankslots_sizes[0] = count_melodic_banks;
    bankslots[0] = outFile->banks_melodic;
    bankslots_sizes[1] = count_percussive_banks;
    bankslots[1] = outFile->banks_percussive;

    if(version >= 2) /* Bank names and LSB/MSB titles */
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                {
                    SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                    return NULL;
                }
                strncpy(bankslots[i][j].bank_name, (const char*)cursor, 32);
                bankslots[i][j].bank_name[32] = '\0';
                bankslots[i][j].bank_midi_lsb = cursor[32];
                bankslots[i][j].bank_midi_msb = cursor[33];
                GO_FORWARD(34);
            }
        }
    }

    {/* Read instruments data */
        uint16_t insSize = 0;
        if(version > 1)
            insSize = WOPN_INST_SIZE_V2;
        else
            insSize = WOPN_INST_SIZE_V1;
        for(i = 0; i < 2; i++)
        {
            if(length < (insSize * 128) * (size_t)bankslots_sizes[i])
            {
                SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                return NULL;
            }

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPNInstrument *ins = &bankslots[i][j].ins[k];
                    WOPN_parseInstrument(ins, cursor, version, 1);
                    GO_FORWARD(insSize);
                }
            }
        }
    }

#undef GO_FORWARD
#undef SET_ERROR

    return outFile;
}